

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O3

void writeFile(MultiPartOutputFile *out,vector<partData,_std::allocator<partData>_> *parts,
              fileMetrics *metrics,bool logPerformance)

{
  size_t __n;
  int iVar1;
  long *plVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  DeepTiledOutputPart outpart;
  string type;
  DeepTiledOutputPart local_58 [8];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  if ((parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar4 = 0xc0;
    lVar7 = 0x30;
    uVar6 = 0;
    do {
      Imf_3_4::MultiPartOutputFile::header((int)out);
      plVar2 = (long *)Imf_3_4::Header::type_abi_cxx11_();
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,*plVar2,plVar2[1] + *plVar2);
      __n = local_48;
      iVar5 = (int)uVar6;
      if (local_48 == DAT_00116500) {
        if (local_48 != 0) {
          iVar1 = bcmp(local_50,Imf_3_4::SCANLINEIMAGE_abi_cxx11_,local_48);
          if (iVar1 != 0) goto LAB_0010c523;
        }
        Imf_3_4::OutputPart::OutputPart((OutputPart *)local_58,out,iVar5);
        pvVar3 = (vector<double,_std::allocator<double>_> *)
                 ((long)&(((metrics->stats).
                           super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                           super__Vector_impl_data._M_start)->countReadPerf).
                         super__Vector_base<double,_std::allocator<double>_> + lVar7);
        if (!logPerformance) {
          pvVar3 = (vector<double,_std::allocator<double>_> *)0x0;
        }
        writeScanLine((OutputPart *)local_58,
                      (FrameBuffer *)
                      ((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48),pvVar3);
      }
      else {
LAB_0010c523:
        if (__n == DAT_00116520) {
          if (__n != 0) {
            iVar1 = bcmp(local_50,Imf_3_4::TILEDIMAGE_abi_cxx11_,__n);
            if (iVar1 != 0) goto LAB_0010c551;
          }
          Imf_3_4::TiledOutputPart::TiledOutputPart((TiledOutputPart *)local_58,out,iVar5);
          pvVar3 = (vector<double,_std::allocator<double>_> *)
                   ((long)&(((metrics->stats).
                             super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                             super__Vector_impl_data._M_start)->countReadPerf).
                           super__Vector_base<double,_std::allocator<double>_> + lVar7);
          if (!logPerformance) {
            pvVar3 = (vector<double,_std::allocator<double>_> *)0x0;
          }
          writeTiled((TiledOutputPart *)local_58,
                     (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                     ((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl
                            .super__Vector_impl_data._M_start + lVar4 + -0x18),pvVar3);
        }
        else {
LAB_0010c551:
          if (__n == DAT_00116540) {
            if (__n != 0) {
              iVar1 = bcmp(local_50,Imf_3_4::DEEPSCANLINE_abi_cxx11_,__n);
              if (iVar1 != 0) goto LAB_0010c57f;
            }
            Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart
                      ((DeepScanLineOutputPart *)local_58,out,iVar5);
            pvVar3 = (vector<double,_std::allocator<double>_> *)
                     ((long)&(((metrics->stats).
                               super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                               super__Vector_impl_data._M_start)->countReadPerf).
                             super__Vector_base<double,_std::allocator<double>_> + lVar7);
            if (!logPerformance) {
              pvVar3 = (vector<double,_std::allocator<double>_> *)0x0;
            }
            writeDeepScanLine((DeepScanLineOutputPart *)local_58,
                              (DeepFrameBuffer *)
                              ((long)&(((parts->
                                        super__Vector_base<partData,_std::allocator<partData>_>).
                                        _M_impl.super__Vector_impl_data._M_start)->readBuf).
                                      scanlinePixelData.
                                      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                              + lVar4),pvVar3);
          }
          else {
LAB_0010c57f:
            if (__n == DAT_00116560) {
              if (__n != 0) {
                iVar1 = bcmp(local_50,Imf_3_4::DEEPTILE_abi_cxx11_,__n);
                if (iVar1 != 0) goto LAB_0010c6a8;
              }
              Imf_3_4::DeepTiledOutputPart::DeepTiledOutputPart(local_58,out,iVar5);
              pvVar3 = (vector<double,_std::allocator<double>_> *)
                       ((long)&(((metrics->stats).
                                 super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                                 super__Vector_impl_data._M_start)->countReadPerf).
                               super__Vector_base<double,_std::allocator<double>_> + lVar7);
              if (!logPerformance) {
                pvVar3 = (vector<double,_std::allocator<double>_> *)0x0;
              }
              writeDeepTiled(local_58,(DeepFrameBuffer *)
                                      ((long)&(((parts->
                                                super__Vector_base<partData,_std::allocator<partData>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->readBuf
                                              ).scanlinePixelData.
                                              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                      + lVar4),pvVar3);
            }
          }
        }
      }
LAB_0010c6a8:
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x250;
      lVar7 = lVar7 + 0xc0;
    } while (uVar6 < (ulong)(((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            0x14c1bacf914c1bad));
  }
  return;
}

Assistant:

void
writeFile (
    MultiPartOutputFile& out,
    vector<partData>&    parts,
    fileMetrics&         metrics,
    bool                 logPerformance)
{
    //
    // Call initialization functions, Read image from source.
    //
    for (size_t p = 0; p < parts.size (); ++p)
    {
        string type = out.header (p).type ();

        if (type == SCANLINEIMAGE)
        {
            OutputPart outpart (out, p);
            writeScanLine (
                outpart,
                parts[p].readBuf.scanlineBuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
        else if (type == TILEDIMAGE)
        {
            TiledOutputPart outpart (out, p);
            writeTiled (
                outpart,
                parts[p].readBuf.tiledBuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
        else if (type == DEEPSCANLINE)
        {
            DeepScanLineOutputPart outpart (out, p);
            writeDeepScanLine (
                outpart,
                parts[p].readBuf.deepbuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
        else if (type == DEEPTILE)
        {
            DeepTiledOutputPart outpart (out, p);
            writeDeepTiled (
                outpart,
                parts[p].readBuf.deepbuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
    }
}